

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  Pgno PVar1;
  int iVar2;
  Pgno PVar3;
  bool bVar4;
  bool local_65;
  MemPage *local_60;
  MemPage *pFreePg_1;
  Pgno iNear;
  u8 eMode;
  MemPage *pLastPg;
  MemPage *pMStack_40;
  Pgno iFreePg_1;
  MemPage *pFreePg;
  Pgno iFreePg;
  Pgno iPtrPage;
  u32 uStack_28;
  u8 eType;
  int rc;
  Pgno nFreeList;
  int bCommit_local;
  Pgno iLastPg_local;
  Pgno nFin_local;
  BtShared *pBt_local;
  
  rc = bCommit;
  nFreeList = iLastPg;
  bCommit_local = nFin;
  _iLastPg_local = pBt;
  PVar1 = ptrmapPageno(pBt,iLastPg);
  PVar3 = iPtrPage;
  if ((PVar1 != nFreeList) && (nFreeList != (uint)sqlite3PendingByte / _iLastPg_local->pageSize + 1)
     ) {
    uStack_28 = sqlite3Get4byte(_iLastPg_local->pPage1->aData + 0x24);
    if (uStack_28 == 0) {
      return 0x65;
    }
    iPtrPage = ptrmapGet(_iLastPg_local,nFreeList,(u8 *)((long)&iFreePg + 3),
                         (Pgno *)((long)&pFreePg + 4));
    if (iPtrPage != 0) {
      return iPtrPage;
    }
    if (iFreePg._3_1_ == '\x01') {
      iVar2 = sqlite3CorruptError(0x10578);
      return iVar2;
    }
    if (iFreePg._3_1_ == '\x02') {
      PVar3 = 0;
      if (rc == 0) {
        iPtrPage = allocateBtreePage(_iLastPg_local,&stack0xffffffffffffffc0,(Pgno *)&pFreePg,
                                     nFreeList,'\x01');
        if (iPtrPage != 0) {
          return iPtrPage;
        }
        releasePage(pMStack_40);
        PVar3 = iPtrPage;
      }
    }
    else {
      pFreePg_1._7_1_ = '\0';
      pFreePg_1._0_4_ = 0;
      iVar2 = btreeGetPage(_iLastPg_local,nFreeList,(MemPage **)&iNear,0);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (rc == 0) {
        pFreePg_1._7_1_ = '\x02';
        pFreePg_1._0_4_ = bCommit_local;
      }
      iPtrPage = 0;
      do {
        iPtrPage = allocateBtreePage(_iLastPg_local,&local_60,(Pgno *)((long)&pLastPg + 4),
                                     (Pgno)pFreePg_1,pFreePg_1._7_1_);
        if (iPtrPage != 0) {
          releasePage(_iNear);
          return iPtrPage;
        }
        releasePage(local_60);
        local_65 = rc != 0 && (uint)bCommit_local < pLastPg._4_4_;
      } while (local_65);
      iPtrPage = relocatePage(_iLastPg_local,_iNear,iFreePg._3_1_,pFreePg._4_4_,pLastPg._4_4_,rc);
      releasePage(_iNear);
      PVar3 = iPtrPage;
      if (iPtrPage != 0) {
        return iPtrPage;
      }
    }
  }
  iPtrPage = PVar3;
  if (rc == 0) {
    do {
      nFreeList = nFreeList - 1;
      bVar4 = true;
      if (nFreeList != (uint)sqlite3PendingByte / _iLastPg_local->pageSize + 1) {
        PVar3 = ptrmapPageno(_iLastPg_local,nFreeList);
        bVar4 = PVar3 == nFreeList;
      }
    } while (bVar4);
    _iLastPg_local->bDoTruncate = '\x01';
    _iLastPg_local->nPage = nFreeList;
  }
  return 0;
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't 
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );
      
      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}